

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableModel::updateRowIndexes
          (QTableModel *this,QModelIndexList *indexes,int movedFromRow,int movedToRow)

{
  int iVar1;
  iterator this_00;
  iterator iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QModelIndex local_68;
  undefined8 local_50;
  quintptr qStack_48;
  QAbstractItemModel *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QList<QModelIndex>::begin(indexes);
  do {
    iVar2 = QList<QModelIndex>::end(indexes);
    if (this_00.i == iVar2.i) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    iVar1 = (this_00.i)->r;
    iVar3 = movedToRow;
    if (iVar1 == movedFromRow) {
LAB_0053695f:
      if (iVar3 != iVar1) goto LAB_00536969;
    }
    else {
      if (movedToRow < iVar1 || iVar1 <= movedFromRow) {
        iVar3 = (uint)(movedToRow <= iVar1 && iVar1 < movedFromRow) + iVar1;
        goto LAB_0053695f;
      }
      iVar3 = iVar1 + -1;
LAB_00536969:
      iVar1 = (this_00.i)->c;
      QModelIndex::parent(&local_68,this_00.i);
      (**(code **)(*(long *)this + 0x60))(&local_50,this,iVar3,iVar1,&local_68);
      ((this_00.i)->m).ptr = local_40;
      (this_00.i)->r = (undefined4)local_50;
      (this_00.i)->c = local_50._4_4_;
      (this_00.i)->i = qStack_48;
    }
    this_00.i = this_00.i + 1;
  } while( true );
}

Assistant:

void QTableModel::updateRowIndexes(QModelIndexList &indexes,
                                   int movedFromRow, int movedToRow)
{
    QModelIndexList::iterator it;
    for (it = indexes.begin(); it != indexes.end(); ++it) {
        int oldRow = (*it).row();
        int newRow = oldRow;
        if (oldRow == movedFromRow)
            newRow = movedToRow;
        else if (movedFromRow < oldRow && movedToRow >= oldRow)
            newRow = oldRow - 1;
        else if (movedFromRow > oldRow && movedToRow <= oldRow)
            newRow = oldRow + 1;
        if (newRow != oldRow)
            *it = index(newRow, (*it).column(), (*it).parent());
    }
}